

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)38,_(unsigned_short)15>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint *puVar2;
  
  puVar2 = *in;
  out[0xf] = (ulong)puVar2[1] << 6 | (ulong)(*puVar2 >> 0x1a);
  uVar1 = puVar2[3];
  out[0x10] = *(ulong *)(puVar2 + 2) & 0x3fffffffff;
  *in = puVar2 + 4;
  out[0x11] = (ulong)(puVar2[4] & 0xfff) << 0x1a | (ulong)(uVar1 >> 6);
  Unroller<(unsigned_short)38,_(unsigned_short)18>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}